

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linked_list.h
# Opt level: O0

LinkedList<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> * __thiscall
data_structures::LinkedList<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement>::clear
          (LinkedList<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *this)

{
  bool bVar1;
  LinkedList<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *this_local;
  
  while( true ) {
    bVar1 = isEmpty(this);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    deleteFromHeader(this);
  }
  this->_tail = this->_header;
  this->_size = 0;
  return this;
}

Assistant:

inline
    LinkedList<T>* LinkedList<T>::clear(){
        while (!isEmpty()) {
            deleteFromHeader();
        }
        _tail = _header;
        _size = 0;
        return this;
    }